

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

long cm_zlib_gzseek(gzFile file,long offset,int whence)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint local_38;
  uint local_34;
  int size_1;
  uInt size;
  gz_stream *s;
  gzFile pvStack_20;
  int whence_local;
  long offset_local;
  gzFile file_local;
  
  if ((((file == (gzFile)0x0) || (whence == 2)) || (*(int *)((long)file + 0x70) == -1)) ||
     (*(int *)((long)file + 0x70) == -3)) {
    file_local = (gzFile)0xffffffffffffffff;
  }
  else {
    pvStack_20 = (gzFile)offset;
    if (*(char *)((long)file + 0xac) == 'w') {
      if (whence == 0) {
        pvStack_20 = (gzFile)(offset - *(long *)((long)file + 0xb8));
      }
      if ((long)pvStack_20 < 0) {
        file_local = (gzFile)0xffffffffffffffff;
      }
      else {
        if (*(long *)((long)file + 0x80) == 0) {
          pvVar3 = malloc(0x4000);
          *(void **)((long)file + 0x80) = pvVar3;
          if (*(long *)((long)file + 0x80) == 0) {
            return -1;
          }
          memset(*(void **)((long)file + 0x80),0,0x4000);
        }
        for (; 0 < (long)pvStack_20; pvStack_20 = (gzFile)((long)pvStack_20 - (ulong)uVar1)) {
          local_34 = 0x4000;
          if ((long)pvStack_20 < 0x4000) {
            local_34 = (uint)pvStack_20;
          }
          uVar1 = cm_zlib_gzwrite(file,*(voidpc *)((long)file + 0x80),local_34);
          if (uVar1 == 0) {
            return -1;
          }
        }
        file_local = *(gzFile *)((long)file + 0xb8);
      }
    }
    else {
      if (whence == 1) {
        pvStack_20 = (gzFile)(*(long *)((long)file + 0xc0) + offset);
      }
      if ((long)pvStack_20 < 0) {
        file_local = (gzFile)0xffffffffffffffff;
      }
      else if (*(int *)((long)file + 0xa8) == 0) {
        if ((long)pvStack_20 < *(long *)((long)file + 0xc0)) {
          iVar2 = cm_zlib_gzrewind(file);
          if (iVar2 < 0) {
            return -1;
          }
        }
        else {
          pvStack_20 = (gzFile)((long)pvStack_20 - *(long *)((long)file + 0xc0));
        }
        if ((pvStack_20 != (gzFile)0x0) && (*(long *)((long)file + 0x88) == 0)) {
          pvVar3 = malloc(0x4000);
          *(void **)((long)file + 0x88) = pvVar3;
          if (*(long *)((long)file + 0x88) == 0) {
            return -1;
          }
        }
        if ((pvStack_20 != (gzFile)0x0) && (*(int *)((long)file + 200) != -1)) {
          *(undefined4 *)((long)file + 200) = 0xffffffff;
          *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + 1;
          pvStack_20 = (gzFile)((long)pvStack_20 + -1);
          if (*(int *)((long)file + 0xcc) != 0) {
            *(undefined4 *)((long)file + 0x70) = 1;
          }
        }
        for (; 0 < (long)pvStack_20; pvStack_20 = (gzFile)((long)pvStack_20 - (long)iVar2)) {
          local_38 = 0x4000;
          if ((long)pvStack_20 < 0x4000) {
            local_38 = (uint)pvStack_20;
          }
          iVar2 = cm_zlib_gzread(file,*(voidp *)((long)file + 0x88),local_38);
          if (iVar2 < 1) {
            return -1;
          }
        }
        file_local = *(gzFile *)((long)file + 0xc0);
      }
      else {
        *(undefined4 *)((long)file + 200) = 0xffffffff;
        *(undefined4 *)((long)file + 8) = 0;
        *(undefined8 *)file = *(undefined8 *)((long)file + 0x80);
        iVar2 = fseek(*(FILE **)((long)file + 0x78),(long)pvStack_20,0);
        if (iVar2 < 0) {
          file_local = (gzFile)0xffffffffffffffff;
        }
        else {
          *(gzFile *)((long)file + 0xc0) = pvStack_20;
          *(gzFile *)((long)file + 0xb8) = pvStack_20;
          file_local = pvStack_20;
        }
      }
    }
  }
  return (long)file_local;
}

Assistant:

z_off_t ZEXPORT gzseek (file, offset, whence)
    gzFile file;
    z_off_t offset;
    int whence;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || whence == SEEK_END ||
        s->z_err == Z_ERRNO || s->z_err == Z_DATA_ERROR) {
        return -1L;
    }

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        return -1L;
#else
        if (whence == SEEK_SET) {
            offset -= s->in;
        }
        if (offset < 0) return -1L;

        /* At this point, offset is the number of zero bytes to write. */
        if (s->inbuf == Z_NULL) {
            s->inbuf = (Byte*)ALLOC(Z_BUFSIZE); /* for seeking */
            if (s->inbuf == Z_NULL) return -1L;
            zmemzero(s->inbuf, Z_BUFSIZE);
        }
        while (offset > 0)  {
            uInt size = Z_BUFSIZE;
            if (offset < Z_BUFSIZE) size = (uInt)offset;

            size = gzwrite(file, s->inbuf, size);
            if (size == 0) return -1L;

            offset -= size;
        }
        return s->in;
#endif
    }
    /* Rest of function is for reading only */

    /* compute absolute position */
    if (whence == SEEK_CUR) {
        offset += s->out;
    }
    if (offset < 0) return -1L;

    if (s->transparent) {
        /* map to fseek */
        s->back = EOF;
        s->stream.avail_in = 0;
        s->stream.next_in = s->inbuf;
        if (fseek(s->file, offset, SEEK_SET) < 0) return -1L;

        s->in = s->out = offset;
        return offset;
    }

    /* For a negative seek, rewind and use positive seek */
    if (offset >= s->out) {
        offset -= s->out;
    } else if (gzrewind(file) < 0) {
        return -1L;
    }
    /* offset is now the number of bytes to skip. */

    if (offset != 0 && s->outbuf == Z_NULL) {
        s->outbuf = (Byte*)ALLOC(Z_BUFSIZE);
        if (s->outbuf == Z_NULL) return -1L;
    }
    if (offset && s->back != EOF) {
        s->back = EOF;
        s->out++;
        offset--;
        if (s->last) s->z_err = Z_STREAM_END;
    }
    while (offset > 0)  {
        int size = Z_BUFSIZE;
        if (offset < Z_BUFSIZE) size = (int)offset;

        size = gzread(file, s->outbuf, (uInt)size);
        if (size <= 0) return -1L;
        offset -= size;
    }
    return s->out;
}